

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testModule.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  char *__ptr;
  size_t sStack_1020;
  hello_world_t hello_world;
  xmlChar filename [4096];
  
  hello_world = (hello_world_t)0x0;
  xmlStrPrintf(filename,0x1000,"%s/testdso%s",".libs",".so");
  lVar2 = xmlModuleOpen(filename,0);
  if (lVar2 == 0) {
    __ptr = "Failed to open module\n";
    sStack_1020 = 0x16;
  }
  else {
    iVar1 = xmlModuleSymbol(lVar2,"hello_world",&hello_world);
    if (iVar1 == 0) {
      if (hello_world != (hello_world_t)0x0) {
        (*hello_world)();
        xmlModuleClose(lVar2);
        return 0;
      }
      __ptr = "Lookup returned NULL\n";
      sStack_1020 = 0x15;
    }
    else {
      __ptr = "Failure to lookup\n";
      sStack_1020 = 0x12;
    }
  }
  fwrite(__ptr,sStack_1020,1,_stderr);
  return 1;
}

Assistant:

int main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    xmlChar filename[PATH_MAX];
    xmlModulePtr module = NULL;
    hello_world_t hello_world = NULL;

    /* build the module filename, and confirm the module exists */
    xmlStrPrintf(filename, sizeof(filename),
                 "%s/testdso%s",
                 (const xmlChar*)MODULE_PATH,
                 (const xmlChar*)LIBXML_MODULE_EXTENSION);

    module = xmlModuleOpen((const char*)filename, 0);
    if (module == NULL) {
      fprintf(stderr, "Failed to open module\n");
      return(1);
    }

    if (xmlModuleSymbol(module, "hello_world", (void **) &hello_world)) {
      fprintf(stderr, "Failure to lookup\n");
      return(1);
    }
    if (hello_world == NULL) {
      fprintf(stderr, "Lookup returned NULL\n");
      return(1);
    }

    (*hello_world)();

    xmlModuleClose(module);

    return(0);
}